

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretInt64(I64ToI32Lowering *this,Unary *curr)

{
  IString str;
  initializer_list<wasm::Expression_*> __l;
  IString str_00;
  initializer_list<wasm::Expression_*> __l_00;
  IString str_01;
  Index index;
  pointer this_00;
  pointer pBVar1;
  pointer pBVar2;
  Call *any;
  Call *append;
  Call *args;
  Block *expression;
  Module *pMVar3;
  IString specific;
  IString local_198;
  Type local_180;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_178;
  size_t local_158;
  char *pcStack_150;
  string_view local_148;
  Type local_138;
  allocator<wasm::Expression_*> local_129;
  Type local_128;
  Const *local_120;
  LocalGet *local_118;
  Const **local_110;
  size_type local_108;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_100;
  size_t local_e8;
  char *pcStack_e0;
  string_view local_d0;
  Type local_c0;
  allocator<wasm::Expression_*> local_b1;
  Const *local_b0;
  undefined8 local_a8;
  Const **local_a0;
  size_type local_98;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  size_t local_68;
  char *pcStack_60;
  string_view local_50;
  Block *local_40;
  Block *result;
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  fetchOutParam((TempVar *)&result,this,curr->value);
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_68 = ABI::wasm2js::SCRATCH_STORE_I32;
  pcStack_60 = DAT_03192da8;
  str_01.str._M_str = DAT_03192da8;
  str_01.str._M_len = ABI::wasm2js::SCRATCH_STORE_I32;
  wasm::Name::Name((Name *)&local_50,str_01);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_b0 = Builder::makeConst<int>(pBVar2,0);
  local_a8 = *(undefined8 *)(highBits.ty.id + 0x18);
  local_a0 = &local_b0;
  local_98 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_b1);
  __l_00._M_len = local_98;
  __l_00._M_array = (iterator)local_a0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_90,__l_00,&local_b1);
  wasm::Type::Type(&local_c0,none);
  any = Builder::makeCall(pBVar1,(Name)local_50,&local_90,local_c0,false);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_e8 = ABI::wasm2js::SCRATCH_STORE_I32;
  pcStack_e0 = DAT_03192da8;
  str_00.str._M_str = DAT_03192da8;
  str_00.str._M_len = ABI::wasm2js::SCRATCH_STORE_I32;
  wasm::Name::Name((Name *)&local_d0,str_00);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_120 = Builder::makeConst<int>(pBVar2,1);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)&result);
  wasm::Type::Type(&local_128,i32);
  local_118 = Builder::makeLocalGet(pBVar2,index,local_128);
  local_110 = &local_120;
  local_108 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_129);
  __l._M_len = local_108;
  __l._M_array = (iterator)local_110;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_100,__l,&local_129);
  wasm::Type::Type(&local_138,none);
  append = Builder::makeCall(pBVar1,(Name)local_d0,&local_100,local_138,false);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_158 = ABI::wasm2js::SCRATCH_LOAD_F64;
  pcStack_150 = DAT_03192dd8;
  str.str._M_str = DAT_03192dd8;
  str.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
  wasm::Name::Name((Name *)&local_148,str);
  local_178.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_178);
  wasm::Type::Type(&local_180,f64);
  args = Builder::makeCall(pBVar1,(Name)local_148,&local_178,local_180,false);
  expression = Builder::blockify<wasm::Call*>(this_00,(Expression *)any,(Expression *)append,args);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_178);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_100);
  std::allocator<wasm::Expression_*>::~allocator(&local_129);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_90);
  std::allocator<wasm::Expression_*>::~allocator(&local_b1);
  local_40 = expression;
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  pMVar3 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       .
                       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                     );
  MemoryUtils::ensureExists(pMVar3);
  pMVar3 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       .
                       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                     );
  local_198.str._M_len = 0;
  local_198.str._M_str = (char *)0x0;
  IString::IString(&local_198);
  specific.str._M_str = (char *)args;
  specific.str._M_len = (size_t)local_198.str._M_str;
  ABI::wasm2js::ensureHelpers((wasm2js *)pMVar3,(Module *)local_198.str._M_len,specific);
  TempVar::~TempVar((TempVar *)&result);
  return;
}

Assistant:

void lowerReinterpretInt64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our i64 through memory at address 0
    TempVar highBits = fetchOutParam(curr->value);
    Block* result = builder->blockify(
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(0)), curr->value},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(1)),
                         builder->makeLocalGet(highBits, Type::i32)},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_F64, {}, Type::f64));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }